

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.hpp
# Opt level: O3

uchar * trial::protocol::json::detail::scan_narrow<unsigned_char>(uchar *marker,uchar *tail)

{
  byte bVar1;
  uint uVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  uchar *puVar6;
  byte *pbVar7;
  int *piVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  puVar6 = marker;
  if (0x10 < (long)tail - (long)marker) {
    lVar5 = -(long)marker;
    do {
      auVar10[0] = -((char)(*marker ^ 2) < '!');
      auVar10[1] = -((char)(marker[1] ^ 2) < '!');
      auVar10[2] = -((char)(marker[2] ^ 2) < '!');
      auVar10[3] = -((char)(marker[3] ^ 2) < '!');
      auVar10[4] = -((char)(marker[4] ^ 2) < '!');
      auVar10[5] = -((char)(marker[5] ^ 2) < '!');
      auVar10[6] = -((char)(marker[6] ^ 2) < '!');
      auVar10[7] = -((char)(marker[7] ^ 2) < '!');
      auVar10[8] = -((char)(marker[8] ^ 2) < '!');
      auVar10[9] = -((char)(marker[9] ^ 2) < '!');
      auVar10[10] = -((char)(marker[10] ^ 2) < '!');
      auVar10[0xb] = -((char)(marker[0xb] ^ 2) < '!');
      auVar10[0xc] = -((char)(marker[0xc] ^ 2) < '!');
      auVar10[0xd] = -((char)(marker[0xd] ^ 2) < '!');
      auVar10[0xe] = -((char)(marker[0xe] ^ 2) < '!');
      auVar10[0xf] = -((char)(marker[0xf] ^ 2) < '!');
      auVar9[0] = -(*marker == '\\');
      auVar9[1] = -(marker[1] == '\\');
      auVar9[2] = -(marker[2] == '\\');
      auVar9[3] = -(marker[3] == '\\');
      auVar9[4] = -(marker[4] == '\\');
      auVar9[5] = -(marker[5] == '\\');
      auVar9[6] = -(marker[6] == '\\');
      auVar9[7] = -(marker[7] == '\\');
      auVar9[8] = -(marker[8] == '\\');
      auVar9[9] = -(marker[9] == '\\');
      auVar9[10] = -(marker[10] == '\\');
      auVar9[0xb] = -(marker[0xb] == '\\');
      auVar9[0xc] = -(marker[0xc] == '\\');
      auVar9[0xd] = -(marker[0xd] == '\\');
      auVar9[0xe] = -(marker[0xe] == '\\');
      auVar9[0xf] = -(marker[0xf] == '\\');
      auVar9 = auVar9 | auVar10;
      uVar3 = (ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar9[0xf] >> 7) << 0xf;
      if (uVar3 != 0) {
        uVar2 = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        return marker + uVar2;
      }
      marker = marker + 0x10;
      lVar4 = lVar5 + -0x10;
      lVar5 = lVar5 + -0x10;
    } while (0x10 < (long)(tail + lVar4));
    puVar6 = (uchar *)-lVar5;
  }
  if (marker != tail) {
    pbVar7 = marker + ((long)tail - (long)puVar6);
    while( true ) {
      bVar1 = *marker;
      if ((long)(char)bVar1 < 0) {
        if (bVar1 < 0xc0) {
          return marker;
        }
        piVar8 = (int *)(traits::to_category<unsigned_char>(unsigned_char)::upper +
                        (ulong)((int)(char)bVar1 & 0x3f) * 4);
      }
      else {
        piVar8 = (int *)(traits::to_category<unsigned_char>(unsigned_char)::lower +
                        (long)(char)bVar1 * 4);
      }
      if (*piVar8 != 0) break;
      marker = marker + 1;
      if (marker == tail) {
        return pbVar7;
      }
    }
    return marker;
  }
  return marker;
}

Assistant:

auto scan_narrow(const CharT *marker,
                 const CharT * const tail) noexcept -> const CharT *
{
#if defined(TRIAL_PROTOCOL_USE_SSE2)
    // Swaps space and quote characters
    const auto permuter = _mm_set1_epi8(0x02);
    // Covers permuted quote and control characters + extra characters
    const auto lower = _mm_set1_epi8(0x21);
    const auto escape = _mm_set1_epi8(0x5e);
    while (tail - marker > 16)
    {
        const auto data = _mm_xor_si128(_mm_loadu_si128((const __m128i *)marker),
                                        permuter);
        const auto avoid = _mm_or_si128(_mm_cmpeq_epi8(data, escape),
                                        _mm_cmplt_epi8(data, lower));
        const auto mask = _mm_movemask_epi8(avoid);
        if (mask != 0)
            return marker + core::detail::countr_zero(mask);
        marker += 16;
    }
#endif

    while (marker != tail)
    {
        if (traits::to_category(*marker) == traits::category::narrow)
        {
            ++marker;
        }
        else
            break;
    }
    return marker;
}